

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xbox.cpp
# Opt level: O0

void rw::xbox::unswizzle(uint8 *dst,uint8 *src,int32 w,int32 h,int32 bpp)

{
  uint local_48;
  uint local_44;
  int32 v;
  int32 u;
  int32 y;
  int32 x;
  int32 c;
  int32 j;
  int32 i;
  uint32 maskV;
  uint32 maskU;
  int32 bpp_local;
  int32 h_local;
  int32 w_local;
  uint8 *src_local;
  uint8 *dst_local;
  
  i = 0;
  j = 0;
  c = 1;
  x = 1;
  do {
    y = 0;
    if (c < w) {
      i = x | i;
      y = x << 1;
      x = y;
    }
    if (c < h) {
      j = x | j;
      y = x << 1;
      x = y;
    }
    c = c << 1;
  } while (y != 0);
  local_48 = 0;
  for (v = 0; v < h; v = v + 1) {
    local_44 = 0;
    for (u = 0; u < w; u = u + 1) {
      memcpy(dst + (v * w + u) * bpp,src + (int)((local_44 | local_48) * bpp),(long)bpp);
      local_44 = local_44 - i & i;
    }
    local_48 = local_48 - j & j;
  }
  return;
}

Assistant:

static void
unswizzle(uint8 *dst, uint8 *src, int32 w, int32 h, int32 bpp)
{
	uint32 maskU = 0;
	uint32 maskV = 0;
	int32 i = 1;
	int32 j = 1;
	int32 c;
	do{
		c = 0;
		if(i < w){
			maskU |= j;
			j <<= 1;
			c = j;
		}
		if(i < h){
			maskV |= j;
			j <<= 1;
			c = j;
		}
		i <<= 1;
	}while(c);
	int32 x, y, u, v;
	v = 0;
	for(y = 0; y < h; y++){
		u = 0;
		for(x = 0; x < w; x++){
			memcpy(&dst[(y*w + x)*bpp], &src[(u|v)*bpp], bpp);
			u = (u - maskU) & maskU;
		}
		v = (v - maskV) & maskV;
	}
}